

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O2

void nk_layout_row_template_end(nk_context *ctx)

{
  uint columns;
  nk_panel *pnVar1;
  ulong uVar2;
  int iVar3;
  ulong uVar4;
  int iVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  
  if (ctx == (nk_context *)0x0) {
    __assert_fail("ctx",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/wjakob[P]glfw/deps/nuklear.h"
                  ,0x4617,"void nk_layout_row_template_end(struct nk_context *)");
  }
  if (ctx->current == (nk_window *)0x0) {
    __assert_fail("ctx->current",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/wjakob[P]glfw/deps/nuklear.h"
                  ,0x4618,"void nk_layout_row_template_end(struct nk_context *)");
  }
  pnVar1 = ctx->current->layout;
  if (pnVar1 == (nk_panel *)0x0) {
    __assert_fail("ctx->current->layout",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/wjakob[P]glfw/deps/nuklear.h"
                  ,0x4619,"void nk_layout_row_template_end(struct nk_context *)");
  }
  if ((pnVar1->row).type == NK_LAYOUT_TEMPLATE) {
    columns = (pnVar1->row).columns;
    uVar2 = 0;
    uVar4 = 0;
    if (0 < (int)columns) {
      uVar4 = (ulong)columns;
    }
    fVar10 = 0.0;
    fVar9 = 0.0;
    fVar8 = 0.0;
    iVar3 = 0;
    iVar5 = 0;
    for (; uVar4 != uVar2; uVar2 = uVar2 + 1) {
      fVar7 = (pnVar1->row).templates[uVar2];
      if (0.0 <= fVar7) {
        fVar9 = fVar9 + fVar7;
        fVar10 = fVar10 + fVar7;
      }
      else if (-1.0 <= fVar7) {
        iVar3 = iVar3 + 1;
        iVar5 = iVar5 + 1;
      }
      else {
        fVar9 = fVar9 - fVar7;
        fVar6 = -fVar7;
        if (-fVar7 <= fVar8) {
          fVar6 = fVar8;
        }
        iVar5 = iVar5 + 1;
        fVar8 = fVar6;
      }
    }
    if (iVar5 != 0) {
      fVar6 = nk_layout_row_calculate_usable_space
                        (&ctx->style,pnVar1->type,(pnVar1->bounds).w,columns);
      fVar7 = 0.0;
      if (0.0 <= fVar6 - fVar10) {
        fVar7 = fVar6 - fVar10;
      }
      fVar7 = fVar7 / (float)iVar5;
      fVar10 = fVar7;
      if (fVar7 < fVar8) {
        fVar10 = 0.0;
        if (0.0 <= fVar6 - fVar9) {
          fVar10 = fVar6 - fVar9;
        }
        fVar10 = fVar10 / (float)iVar3;
      }
      for (uVar2 = 0; uVar4 != uVar2; uVar2 = uVar2 + 1) {
        fVar9 = (pnVar1->row).templates[uVar2];
        fVar6 = fVar9;
        if (((fVar9 < 0.0) && (fVar6 = fVar10, fVar7 < fVar8)) && (fVar9 < -1.0)) {
          fVar6 = -fVar9;
        }
        (pnVar1->row).templates[uVar2] = fVar6;
      }
    }
    return;
  }
  __assert_fail("layout->row.type == NK_LAYOUT_TEMPLATE",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/wjakob[P]glfw/deps/nuklear.h"
                ,0x461f,"void nk_layout_row_template_end(struct nk_context *)");
}

Assistant:

NK_API void
nk_layout_row_template_end(struct nk_context *ctx)
{
    struct nk_window *win;
    struct nk_panel *layout;

    int i = 0;
    int variable_count = 0;
    int min_variable_count = 0;
    float min_fixed_width = 0.0f;
    float total_fixed_width = 0.0f;
    float max_variable_width = 0.0f;

    NK_ASSERT(ctx);
    NK_ASSERT(ctx->current);
    NK_ASSERT(ctx->current->layout);
    if (!ctx || !ctx->current || !ctx->current->layout)
        return;

    win = ctx->current;
    layout = win->layout;
    NK_ASSERT(layout->row.type == NK_LAYOUT_TEMPLATE);
    if (layout->row.type != NK_LAYOUT_TEMPLATE) return;
    for (i = 0; i < layout->row.columns; ++i) {
        float width = layout->row.templates[i];
        if (width >= 0.0f) {
            total_fixed_width += width;
            min_fixed_width += width;
        } else if (width < -1.0f) {
            width = -width;
            total_fixed_width += width;
            max_variable_width = NK_MAX(max_variable_width, width);
            variable_count++;
        } else {
            min_variable_count++;
            variable_count++;
        }
    }
    if (variable_count) {
        float space = nk_layout_row_calculate_usable_space(&ctx->style, layout->type,
                            layout->bounds.w, layout->row.columns);
        float var_width = (NK_MAX(space-min_fixed_width,0.0f)) / (float)variable_count;
        int enough_space = var_width >= max_variable_width;
        if (!enough_space)
            var_width = (NK_MAX(space-total_fixed_width,0)) / (float)min_variable_count;
        for (i = 0; i < layout->row.columns; ++i) {
            float *width = &layout->row.templates[i];
            *width = (*width >= 0.0f)? *width: (*width < -1.0f && !enough_space)? -(*width): var_width;
        }
    }
}